

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

ostream * add_options(ostream *o,MetaContainer meta)

{
  char *pcVar1;
  char *__s;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  size_t sVar6;
  bool bVar7;
  string sym_names;
  MetaIterator local_78;
  MetaIterator local_68;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"xyzabcdefghijklmnopqrstuvw","");
  if ((meta.str_ptr == (char *)0x0) || (*meta.str_ptr != ':')) {
    rtosc::Port::MetaIterator::MetaIterator(&local_78,meta.str_ptr);
  }
  else {
    rtosc::Port::MetaIterator::MetaIterator(&local_78,meta.str_ptr + 1);
  }
  local_68.title = (char *)CONCAT71(local_78.title._1_7_,local_78.title._0_1_);
  local_68.value = local_78.value;
  rtosc::Port::MetaIterator::MetaIterator(&local_78,(char *)0x0);
  pcVar1 = (char *)CONCAT71(local_78.title._1_7_,local_78.title._0_1_);
  local_58 = meta.str_ptr;
  if (local_68.title == pcVar1) {
    bVar7 = false;
  }
  else {
    bVar7 = false;
    do {
      pcVar3 = strstr(local_68.title,"map ");
      if (pcVar3 != (char *)0x0) {
        bVar7 = true;
      }
      rtosc::Port::MetaIterator::operator++(&local_68);
    } while (local_68.title != pcVar1);
  }
  if ((local_58 == (char *)0x0) || (*local_58 != ':')) {
    rtosc::Port::MetaIterator::MetaIterator(&local_78,local_58);
  }
  else {
    rtosc::Port::MetaIterator::MetaIterator(&local_78,local_58 + 1);
  }
  local_68.title = (char *)CONCAT71(local_78.title._1_7_,local_78.title._0_1_);
  local_68.value = local_78.value;
  rtosc::Port::MetaIterator::MetaIterator(&local_78,(char *)0x0);
  pcVar1 = (char *)CONCAT71(local_78.title._1_7_,local_78.title._0_1_);
  if (local_68.title != pcVar1) {
    do {
      pcVar3 = local_68.title;
      iVar2 = strcmp(local_68.title,"documentation");
      if ((((iVar2 != 0) && (iVar2 = strcmp(pcVar3,"parameter"), iVar2 != 0)) &&
          (iVar2 = strcmp(pcVar3,"max"), iVar2 != 0)) && (iVar2 = strcmp(pcVar3,"min"), iVar2 != 0))
      {
        printf("m.title = <%s>\n",pcVar3);
      }
      rtosc::Port::MetaIterator::operator++(&local_68);
    } while (local_68.title != pcVar1);
  }
  if (bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>(o,"    <hints>\n",0xc);
    if ((local_58 == (char *)0x0) || (*local_58 != ':')) {
      rtosc::Port::MetaIterator::MetaIterator(&local_78,local_58);
    }
    else {
      rtosc::Port::MetaIterator::MetaIterator(&local_78,local_58 + 1);
    }
    local_68.title = (char *)CONCAT71(local_78.title._1_7_,local_78.title._0_1_);
    local_68.value = local_78.value;
    rtosc::Port::MetaIterator::MetaIterator(&local_78,(char *)0x0);
    pcVar1 = (char *)CONCAT71(local_78.title._1_7_,local_78.title._0_1_);
    if (local_68.title != pcVar1) {
      iVar2 = 0;
      do {
        __s = local_68.value;
        pcVar3 = local_68.title;
        pcVar4 = strstr(local_68.title,"map ");
        if (pcVar4 != (char *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>(o,"      <point symbol=\"",0x15);
          local_78.title._0_1_ = *(undefined1 *)((long)local_50[0] + (long)iVar2);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>(o,(char *)&local_78,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" value=\"",9);
          sVar6 = strlen(pcVar3 + 4);
          std::__ostream_insert<char,std::char_traits<char>>(o,pcVar3 + 4,sVar6);
          std::__ostream_insert<char,std::char_traits<char>>(o,"\">",2);
          if (__s == (char *)0x0) {
            std::ios::clear((int)o + (int)*(undefined8 *)(*(long *)o + -0x18));
          }
          else {
            sVar6 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>(o,__s,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>(o,"</point>\n",9);
          iVar2 = iVar2 + 1;
        }
        rtosc::Port::MetaIterator::operator++(&local_68);
      } while (local_68.title != pcVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(o,"    </hints>\n",0xd);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return o;
}

Assistant:

static ostream &add_options(ostream &o, Port::MetaContainer meta)
{
    string sym_names = "xyzabcdefghijklmnopqrstuvw";
    int sym_idx = 0;
    bool has_options = false;
    for(auto m:meta)
        if(strstr(m.title, "map "))
            has_options = true;
    for(auto m:meta)
        if(strcmp(m.title, "documentation") &&
                strcmp(m.title, "parameter") &&
                strcmp(m.title, "max") &&
                strcmp(m.title, "min"))
        printf("m.title = <%s>\n", m.title);

    if(!has_options)
        return o;

    o << "    <hints>\n";
    for(auto m:meta) {
        if(strstr(m.title, "map ")) {
            o << "      <point symbol=\"" << sym_names[sym_idx++] << "\" value=\"";
            o << m.title+4 << "\">" << m.value << "</point>\n";
        }
    }
    o << "    </hints>\n";

    return o;
}